

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x11_window.c
# Opt level: O0

int getWindowState(_GLFWwindow *window)

{
  unsigned_long uVar1;
  int *local_20;
  anon_struct_16_2_032570bf *state;
  _GLFWwindow *p_Stack_10;
  int result;
  _GLFWwindow *window_local;
  
  state._4_4_ = 0;
  local_20 = (int *)0x0;
  p_Stack_10 = window;
  uVar1 = _glfwGetWindowProperty
                    ((window->x11).handle,_glfw.x11.WM_STATE,_glfw.x11.WM_STATE,(uchar **)&local_20)
  ;
  if (1 < uVar1) {
    state._4_4_ = *local_20;
  }
  XFree(local_20);
  return state._4_4_;
}

Assistant:

static int getWindowState(_GLFWwindow* window)
{
    int result = WithdrawnState;
    struct {
        CARD32 state;
        Window icon;
    } *state = NULL;

    if (_glfwGetWindowProperty(window->x11.handle,
                               _glfw.x11.WM_STATE,
                               _glfw.x11.WM_STATE,
                               (unsigned char**) &state) >= 2)
    {
        result = state->state;
    }

    XFree(state);
    return result;
}